

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_migrate.c
# Opt level: O0

REF_STATUS ref_migrate_free(REF_MIGRATE ref_migrate)

{
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_MIGRATE ref_migrate_local;
  
  if (ref_migrate == (REF_MIGRATE)0x0) {
    ref_migrate_local._4_4_ = 2;
  }
  else {
    if (ref_migrate->age != (REF_INT *)0x0) {
      free(ref_migrate->age);
    }
    if (ref_migrate->weight != (REF_DBL *)0x0) {
      free(ref_migrate->weight);
    }
    if (ref_migrate->xyz != (REF_DBL *)0x0) {
      free(ref_migrate->xyz);
    }
    if (ref_migrate->global != (REF_GLOB *)0x0) {
      free(ref_migrate->global);
    }
    ref_migrate_local._4_4_ = ref_adj_free(ref_migrate->conn);
    if (ref_migrate_local._4_4_ == 0) {
      ref_migrate_local._4_4_ = ref_adj_free(ref_migrate->parent_part);
      if (ref_migrate_local._4_4_ == 0) {
        ref_migrate_local._4_4_ = ref_adj_free(ref_migrate->parent_local);
        if (ref_migrate_local._4_4_ == 0) {
          if (ref_migrate != (REF_MIGRATE)0x0) {
            free(ref_migrate);
          }
          ref_migrate_local._4_4_ = 0;
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c"
                 ,0x83,"ref_migrate_free",(ulong)ref_migrate_local._4_4_,"free adj");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
               0x82,"ref_migrate_free",(ulong)ref_migrate_local._4_4_,"free adj");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_migrate.c",
             0x81,"ref_migrate_free",(ulong)ref_migrate_local._4_4_,"free adj");
    }
  }
  return ref_migrate_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_migrate_free(REF_MIGRATE ref_migrate) {
  if (NULL == (void *)ref_migrate) return REF_NULL;

  ref_free(ref_migrate->age);
  ref_free(ref_migrate->weight);
  ref_free(ref_migrate->xyz);
  ref_free(ref_migrate->global);

  RSS(ref_adj_free(ref_migrate_conn(ref_migrate)), "free adj");
  RSS(ref_adj_free(ref_migrate_parent_part(ref_migrate)), "free adj");
  RSS(ref_adj_free(ref_migrate_parent_local(ref_migrate)), "free adj");

  ref_free(ref_migrate);

  return REF_SUCCESS;
}